

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O1

string * __thiscall
cmTargetIncludeDirectoriesCommand::Join
          (string *__return_storage_ptr__,cmTargetIncludeDirectoriesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *__s;
  long *plVar3;
  size_type sVar4;
  size_type *psVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  pointer input;
  string prefix;
  string sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  __s = cmMakefile::GetCurrentSourceDirectory
                  ((this->super_cmTargetPropCommandBase).super_cmCommand.Makefile);
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/","");
  strlen(__s);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)__s);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_98.field_2._M_allocated_capacity = *psVar5;
    local_98.field_2._8_8_ = plVar3[3];
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar5;
    local_98._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_98._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  input = (content->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (input != (content->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      bVar2 = cmsys::SystemTools::FileIsFullPath((input->_M_dataplus)._M_p);
      if ((bVar2) || (sVar4 = cmGeneratorExpression::Find(input), sVar4 == 0)) {
        std::operator+(&local_b8,&local_78,input);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
        uVar6 = local_b8.field_2._M_allocated_capacity;
        _Var7._M_p = local_b8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) goto LAB_0034c550;
      }
      else {
        std::operator+(&local_50,&local_78,&local_98);
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_50,(ulong)(input->_M_dataplus)._M_p);
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_b8.field_2._M_allocated_capacity = *psVar5;
          local_b8.field_2._8_8_ = plVar3[3];
          local_b8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar5;
          local_b8._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_b8._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        uVar6 = local_50.field_2._M_allocated_capacity;
        _Var7._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0034c550:
          operator_delete(_Var7._M_p,uVar6 + 1);
        }
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_78,0,(char *)local_78._M_string_length,0x4ade95);
      input = input + 1;
    } while (input != (content->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTargetIncludeDirectoriesCommand
::Join(const std::vector<std::string> &content)
{
  std::string dirs;
  std::string sep;
  std::string prefix =
      this->Makefile->GetCurrentSourceDirectory() + std::string("/");
  for(std::vector<std::string>::const_iterator it = content.begin();
    it != content.end(); ++it)
    {
    if (cmSystemTools::FileIsFullPath(it->c_str())
        || cmGeneratorExpression::Find(*it) == 0)
      {
      dirs += sep + *it;
      }
    else
      {
      dirs += sep + prefix + *it;
      }
    sep = ";";
    }
  return dirs;
}